

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::CountOuters(SQFuncState *this,SQInteger stacksize)

{
  size_type sVar1;
  SQLocalVarInfo *pSVar2;
  long in_RSI;
  long in_RDI;
  SQLocalVarInfo *lvi;
  SQInteger k;
  SQInteger outers;
  ulong local_20;
  long local_18;
  
  local_18 = 0;
  sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                    ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10));
  local_20 = (ulong)(sVar1 - 1);
  while (in_RSI <= (long)local_20) {
    pSVar2 = sqvector<SQLocalVarInfo,_unsigned_int>::operator[]
                       ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10),
                        (size_type)local_20);
    local_20 = local_20 - 1;
    if (pSVar2->_end_op == 0xffffffff) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

SQInteger SQFuncState::CountOuters(SQInteger stacksize)
{
    SQInteger outers = 0;
    SQInteger k = _vlocals.size() - 1;
    while(k >= stacksize) {
        SQLocalVarInfo &lvi = _vlocals[k];
        k--;
        if(lvi._end_op == UINT32_MINUS_ONE) { //this means is an outer
            outers++;
        }
    }
    return outers;
}